

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_iface.hpp
# Opt level: O0

bool __thiscall
Args::GroupIface::isMisspelledName(GroupIface *this,String *name,StringList *possibleNames)

{
  GroupIface *in_RDI;
  bool ret;
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *in_stack_ffffffffffffff78;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  in_stack_ffffffffffffff90;
  anon_class_24_3_1ddcd56a in_stack_ffffffffffffffa0;
  byte local_19 [25];
  
  local_19[0] = 0;
  children(in_RDI);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cbegin(in_stack_ffffffffffffff78);
  children(in_RDI);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cend(in_stack_ffffffffffffff78);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,Args::GroupIface::isMisspelledName(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)const::_lambda(auto:1_const&)_1_>
            (in_stack_ffffffffffffff90,
             (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)local_19,
             in_stack_ffffffffffffffa0);
  return (bool)(local_19[0] & 1);
}

Assistant:

bool isMisspelledName(
		//! Name to check (misspelled).
		const String & name,
		//! List of possible names for the given misspelled name.
		StringList & possibleNames ) const override
	{
		bool ret = false;

		std::for_each( children().cbegin(), children().cend(),
			[ & ] ( const auto & ch )
			{
				if( ch->isMisspelledName( name, possibleNames ) )
					ret = true;
			} );

		return ret;
	}